

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<long_double>::default_cost_type
          (default_cost_type<long_double> *this,default_cost_type<long_double> *other,int n)

{
  pointer __first;
  pointer __result;
  int n_local;
  default_cost_type<long_double> *other_local;
  default_cost_type<long_double> *this_local;
  
  this->obj = other->obj;
  std::make_unique<long_double[]>((size_t)&this->linear_elements);
  __first = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                      (&other->linear_elements);
  __result = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                       (&this->linear_elements);
  std::copy_n<long_double*,int,long_double*>(__first,n,__result);
  return;
}

Assistant:

default_cost_type(const default_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
    }